

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall
helics::FederateState::processCommunications(FederateState *this,milliseconds period)

{
  MessageProcessingResult MVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  ActionMessage treq;
  timespec local_e8;
  ActionMessage local_d8;
  
  ActionMessage::ActionMessage(&local_d8,cmd_user_return);
  local_d8.source_id.gid = (this->global_id)._M_i.gid;
  local_e8.tv_sec = pthread_self();
  local_d8.messageID = std::_Hash_bytes(&local_e8,8,0xc70f6907);
  addAction(this,&local_d8);
  MVar1 = CONTINUE_PROCESSING;
  lVar3 = std::chrono::_V2::steady_clock::now();
  do {
    if (MVar1 == USER_RETURN) {
      if (9 < period.__r) {
        lVar4 = std::chrono::_V2::steady_clock::now();
        uVar6 = period.__r * 1000000 + (lVar3 - lVar4);
        if (10000000 < (long)uVar6) {
          local_e8.tv_sec = uVar6 / 1000000000;
          local_e8.tv_nsec = uVar6 % 1000000000;
          goto LAB_002c94d1;
        }
      }
      break;
    }
    MVar1 = genericUnspecifiedQueueProcess(this,true);
  } while (MVar1 != BUSY);
  goto LAB_002c94f5;
  while (piVar5 = __errno_location(), *piVar5 == 4) {
LAB_002c94d1:
    iVar2 = nanosleep(&local_e8,&local_e8);
    if (iVar2 != -1) break;
  }
  processCommunications(this,(milliseconds)0x0);
LAB_002c94f5:
  ActionMessage::~ActionMessage(&local_d8);
  return;
}

Assistant:

void FederateState::processCommunications(std::chrono::milliseconds period)
{
    ActionMessage treq(CMD_USER_RETURN);
    treq.source_id = global_id.load();
    // the user return should only be for this thread, other threads will ignore it
    treq.messageID = static_cast<int32_t>(std::hash<std::thread::id>{}(std::this_thread::get_id()));
    addAction(treq);
    auto starttime = std::chrono::steady_clock::now();
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    while (ret != MessageProcessingResult::USER_RETURN) {
        ret = genericUnspecifiedQueueProcess(true);
        if (ret == MessageProcessingResult::BUSY) {
            return;
        }
    }
    if (period >= std::chrono::milliseconds(10)) {
        auto ctime = std::chrono::steady_clock::now();
        if (period - (ctime - starttime) > std::chrono::milliseconds(10)) {
            std::this_thread::sleep_for(period - (ctime - starttime));
            processCommunications(std::chrono::milliseconds(0));
        }
    }
}